

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnDelegate(TypeChecker *this,Index depth)

{
  bool bVar1;
  Result RVar2;
  Label *local_38;
  Label *try_label;
  Label *local_28;
  Label *label;
  Result result;
  Index depth_local;
  TypeChecker *this_local;
  
  label._4_4_ = depth;
  _result = this;
  Result::Result((Result *)&label,Ok);
  try_label._4_4_ = GetLabel(this,label._4_4_ + 1,&local_28);
  bVar1 = Failed(try_label._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = TopLabel(this,&local_38);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = CheckLabelType(this,local_38,Try);
      Result::operator|=((Result *)&label,RVar2);
      RVar2 = PopAndCheckSignature(this,&local_38->result_types,"try block");
      Result::operator|=((Result *)&label,RVar2);
      RVar2 = CheckTypeStackEnd(this,"try block");
      Result::operator|=((Result *)&label,RVar2);
      ResetTypeStackToLabel(this,local_38);
      PushTypes(this,&local_38->result_types);
      PopLabel(this);
      this_local._4_4_ = (Enum)label;
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnDelegate(Index depth) {
  Result result = Result::Ok;
  Label* label;
  // Delegate starts counting after the current try, as the delegate
  // instruction is not actually in the try block.
  CHECK_RESULT(GetLabel(depth + 1, &label));

  Label* try_label;
  CHECK_RESULT(TopLabel(&try_label));
  result |= CheckLabelType(try_label, LabelType::Try);
  result |= PopAndCheckSignature(try_label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(try_label);

  // Since an end instruction does not follow a delegate, we push
  // the block results here and pop the label.
  PushTypes(try_label->result_types);
  PopLabel();
  return result;
}